

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O1

int Ses_StoreGetEntrySimple
              (Ses_Store_t *pStore,word *pTruth,int nVars,int *pArrTimeProfile,char **pSol)

{
  Ses_TimesEntry_t *pSVar1;
  ulong uVar2;
  Ses_TimesEntry_t *pSVar3;
  ulong uVar4;
  Ses_TruthEntry_t *pSVar5;
  Ses_TimesEntry_t *pSVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar2 = (ulong)(uint)(1 << ((char)nVars - 6U & 0x1f));
  if (nVars < 7) {
    uVar2 = 1;
  }
  uVar8 = 0;
  if (0 < (int)uVar2) {
    uVar4 = 0;
    do {
      uVar7 = (uint)uVar8 ^
              *(int *)(Ses_StoreTableHash_s_Primes + (ulong)((uint)uVar4 & 0xf) * 4) *
              (int)pTruth[uVar4];
      uVar8 = (ulong)uVar7;
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
    uVar8 = (ulong)(uVar7 & 0x3ff);
  }
  pSVar5 = pStore->pEntries[uVar8];
  do {
    if (pSVar5 == (Ses_TruthEntry_t *)0x0) {
      return 0;
    }
    if (((int)uVar2 < 1) || (pSVar5->nVars != nVars)) {
      if (pSVar5->nVars == nVars) {
LAB_002b9b6d:
        pSVar1 = pSVar5->head;
        if (pSVar1 == (Ses_TimesEntry_t *)0x0) {
          return 0;
        }
        pSVar6 = pSVar1;
        while (pSVar3 = pSVar1, 0 < nVars) {
          uVar2 = 0;
          while (pArrTimeProfile[uVar2] == pSVar6->pArrTimeProfile[uVar2]) {
            uVar2 = uVar2 + 1;
            pSVar3 = pSVar6;
            if ((uint)nVars == uVar2) goto LAB_002b9ba9;
          }
          pSVar6 = pSVar6->next;
          if (pSVar6 == (Ses_TimesEntry_t *)0x0) {
            return 0;
          }
        }
LAB_002b9ba9:
        *pSol = pSVar3->pNetwork;
        return 1;
      }
    }
    else {
      uVar8 = 0;
      while (pSVar5->pTruth[uVar8] == pTruth[uVar8]) {
        uVar8 = uVar8 + 1;
        if (uVar2 == uVar8) goto LAB_002b9b6d;
      }
    }
    pSVar5 = pSVar5->next;
  } while( true );
}

Assistant:

int Ses_StoreGetEntrySimple( Ses_Store_t * pStore, word * pTruth, int nVars, int * pArrTimeProfile, char ** pSol )
{
    int key;
    Ses_TruthEntry_t * pTEntry;
    Ses_TimesEntry_t * pTiEntry;

    key = Ses_StoreTableHash( pTruth, nVars );
    pTEntry = pStore->pEntries[key];

    /* find truth table entry */
    while ( pTEntry )
    {
        if ( Ses_StoreTruthEqual( pTEntry, pTruth, nVars ) )
            break;
        else
            pTEntry = pTEntry->next;
    }

    /* no entry found? */
    if ( !pTEntry )
        return 0;

    /* find times entry */
    pTiEntry = pTEntry->head;
    while ( pTiEntry )
    {
        if ( Ses_StoreTimesEqual( pArrTimeProfile, pTiEntry->pArrTimeProfile, nVars ) )
            break;
        else
            pTiEntry = pTiEntry->next;
    }

    /* no entry found? */
    if ( !pTiEntry )
        return 0;

    *pSol = pTiEntry->pNetwork;
    return 1;
}